

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zaxpy.c
# Opt level: O0

void zaxpy_(integer *n,doublecomplex *za,doublecomplex *zx,integer *incx,doublecomplex *zy,
           integer *incy)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  doublereal dVar6;
  int local_64;
  int local_60;
  integer iy;
  integer ix;
  integer i;
  doublecomplex z__2;
  doublecomplex z__1;
  integer *incy_local;
  doublecomplex *zy_local;
  integer *incx_local;
  doublecomplex *zx_local;
  doublecomplex *za_local;
  integer *n_local;
  
  if (0 < *n) {
    dVar6 = dcabs1_(za);
    if ((dVar6 != 0.0) || (NAN(dVar6))) {
      if ((*incx == 1) && (*incy == 1)) {
        for (iy = 1; iy <= *n; iy = iy + 1) {
          dVar1 = za->r;
          dVar2 = zx[iy + -1].i;
          dVar3 = za->i;
          dVar4 = zx[iy + -1].r;
          dVar5 = zy[iy + -1].i;
          zy[iy + -1].r = zy[iy + -1].r + za->r * zx[iy + -1].r + -(za->i * zx[iy + -1].i);
          zy[iy + -1].i = dVar5 + dVar1 * dVar2 + dVar3 * dVar4;
        }
      }
      else {
        local_60 = 1;
        local_64 = 1;
        if (*incx < 0) {
          local_60 = (1 - *n) * *incx + 1;
        }
        if (*incy < 0) {
          local_64 = (1 - *n) * *incy + 1;
        }
        for (iy = 1; iy <= *n; iy = iy + 1) {
          dVar1 = za->r;
          dVar2 = zx[local_60 + -1].i;
          dVar3 = za->i;
          dVar4 = zx[local_60 + -1].r;
          dVar5 = zy[local_64 + -1].i;
          zy[local_64 + -1].r =
               zy[local_64 + -1].r + za->r * zx[local_60 + -1].r + -(za->i * zx[local_60 + -1].i);
          zy[local_64 + -1].i = dVar5 + dVar1 * dVar2 + dVar3 * dVar4;
          local_60 = *incx + local_60;
          local_64 = *incy + local_64;
        }
      }
    }
  }
  return;
}

Assistant:

void zaxpy_(integer *n, doublecomplex *za, doublecomplex *zx, 
	integer *incx, doublecomplex *zy, integer *incy)
{


    /* System generated locals */

    doublecomplex z__1, z__2;

    /* Local variables */
    integer i;
    extern doublereal dcabs1_(doublecomplex *);
    integer ix, iy;


/*     constant times a vector plus a vector.   
       jack dongarra, 3/11/78.   
       modified 12/3/93, array(1) declarations changed to array(*)   

    
   Parameter adjustments   
       Function Body */
#define ZY(I) zy[(I)-1]
#define ZX(I) zx[(I)-1]


    if (*n <= 0) {
	return;
    }
    if (dcabs1_(za) == 0.) {
	return;
    }
    if (*incx == 1 && *incy == 1) {
	goto L20;
    }

/*        code for unequal increments or equal increments   
            not equal to 1 */

    ix = 1;
    iy = 1;
    if (*incx < 0) {
	ix = (-(*n) + 1) * *incx + 1;
    }
    if (*incy < 0) {
	iy = (-(*n) + 1) * *incy + 1;
    }
    for (i = 1; i <= *n; ++i) {
	z__2.r = za->r * ZX(ix).r - za->i * ZX(ix).i, z__2.i = za->r * ZX(
		ix).i + za->i * ZX(ix).r;
	z__1.r = ZY(iy).r + z__2.r, z__1.i = ZY(iy).i + z__2.i;
	ZY(iy).r = z__1.r, ZY(iy).i = z__1.i;
	ix += *incx;
	iy += *incy;
/* L10: */
    }
    return;

/*        code for both increments equal to 1 */

L20:
    for (i = 1; i <= *n; ++i) {
	z__2.r = za->r * ZX(i).r - za->i * ZX(i).i, z__2.i = za->r * ZX(
		i).i + za->i * ZX(i).r;
	z__1.r = ZY(i).r + z__2.r, z__1.i = ZY(i).i + z__2.i;
	ZY(i).r = z__1.r, ZY(i).i = z__1.i;
/* L30: */
    }
    return;
}